

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::InstrumentPass::GetVec4FloatId(InstrumentPass *this)

{
  uint32_t uVar1;
  IRContext *this_00;
  Type *type;
  Type *reg_v4float_ty;
  Vector v4float_ty;
  Type *reg_float_ty;
  Float float_ty;
  TypeManager *type_mgr;
  InstrumentPass *this_local;
  
  if (this->v4float_id_ == 0) {
    this_00 = Pass::context(&this->super_Pass);
    float_ty.super_Type._32_8_ = IRContext::get_type_mgr(this_00);
    analysis::Float::Float((Float *)&reg_float_ty,0x20);
    v4float_ty._48_8_ =
         analysis::TypeManager::GetRegisteredType
                   ((TypeManager *)float_ty.super_Type._32_8_,(Type *)&reg_float_ty);
    analysis::Vector::Vector((Vector *)&reg_v4float_ty,(Type *)v4float_ty._48_8_,4);
    type = analysis::TypeManager::GetRegisteredType
                     ((TypeManager *)float_ty.super_Type._32_8_,(Type *)&reg_v4float_ty);
    uVar1 = analysis::TypeManager::GetTypeInstruction
                      ((TypeManager *)float_ty.super_Type._32_8_,type);
    this->v4float_id_ = uVar1;
    analysis::Vector::~Vector((Vector *)&reg_v4float_ty);
    analysis::Float::~Float((Float *)&reg_float_ty);
  }
  return this->v4float_id_;
}

Assistant:

uint32_t InstrumentPass::GetVec4FloatId() {
  if (v4float_id_ == 0) {
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Float float_ty(32);
    analysis::Type* reg_float_ty = type_mgr->GetRegisteredType(&float_ty);
    analysis::Vector v4float_ty(reg_float_ty, 4);
    analysis::Type* reg_v4float_ty = type_mgr->GetRegisteredType(&v4float_ty);
    v4float_id_ = type_mgr->GetTypeInstruction(reg_v4float_ty);
  }
  return v4float_id_;
}